

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O3

vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> * __thiscall
yyml::nn::NN::Parameters
          (vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
           *__return_storage_ptr__,NN *this)

{
  _Hash_node_base *p_Var1;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> layer_params;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
  name_and_layer_pair;
  void *local_68;
  undefined8 local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  _Hash_node_base *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->layers_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,p_Var1[1]._M_nxt,
                 (long)&(p_Var1[1]._M_nxt)->_M_nxt + (long)&(p_Var1[2]._M_nxt)->_M_nxt);
      local_30 = p_Var1[5]._M_nxt;
      (*(code *)local_30->_M_nxt[1]._M_nxt)(&local_68);
      std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<yyml::nn::Variable<double>**,std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>>>
                ((vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,local_68,local_60);
      if (local_68 != (void *)0x0) {
        operator_delete(local_68,local_58 - (long)local_68);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Variable<double>*> Parameters() {
    std::vector<Variable<double>*> parameters;
    for (auto name_and_layer_pair : layers_) {
      auto* layer = name_and_layer_pair.second;
      auto layer_params = layer->Parameters();
      parameters.insert(parameters.end(), layer_params.begin(),
                        layer_params.end());
    }
    return parameters;
  }